

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SendBuffer.h
# Opt level: O3

char * __thiscall SendBuffer::read_pos(SendBuffer *this)

{
  Error *this_00;
  
  if (this->full != 0) {
    return (this->buf)._M_dataplus._M_p + this->read;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this_00,"Buffer is empty");
  __cxa_throw(this_00,&Error::typeinfo,std::exception::~exception);
}

Assistant:

char *read_pos() {
    if (full == 0) {
      throw Error("Buffer is empty");
    }
    return &buf[read];
  }